

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<btAlignedObjectArray<int>_>::btAlignedObjectArray
          (btAlignedObjectArray<btAlignedObjectArray<int>_> *this,
          btAlignedObjectArray<btAlignedObjectArray<int>_> *otherArray)

{
  uint newsize;
  btAlignedObjectArray<int> *pbVar1;
  long lVar2;
  btAlignedObjectArray<int> local_40;
  
  this->m_ownsMemory = true;
  this->m_data = (btAlignedObjectArray<int> *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  newsize = otherArray->m_size;
  local_40.m_ownsMemory = true;
  local_40.m_data = (int *)0x0;
  local_40.m_size = 0;
  local_40.m_capacity = 0;
  resize(this,newsize,&local_40);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_40);
  if (0 < (int)newsize) {
    pbVar1 = this->m_data;
    lVar2 = 0;
    do {
      btAlignedObjectArray<int>::btAlignedObjectArray
                ((btAlignedObjectArray<int> *)(&pbVar1->field_0x0 + lVar2),
                 (btAlignedObjectArray<int> *)(&otherArray->m_data->field_0x0 + lVar2));
      lVar2 = lVar2 + 0x20;
    } while ((ulong)newsize << 5 != lVar2);
  }
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}